

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O0

void __thiscall SStringView_Substr_Test::TestBody(SStringView_Substr_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_t length;
  raw_sstring_view rVar3;
  AssertHelper local_118;
  Message local_110;
  sstring_view<const_char_*> local_108;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  sstring_view<const_char_*> local_d8;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  sstring_view<const_char_*> local_a8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80;
  sstring_view<const_char_*> local_78;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  sv_type sv;
  allocator local_31;
  string local_30 [8];
  string src;
  SStringView_Substr_Test *this_local;
  
  src.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"abc",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pcVar2 = (char *)std::__cxx11::string::data();
  length = std::__cxx11::string::length();
  rVar3 = pstore::make_sstring_view(pcVar2,length);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )rVar3.ptr_;
  local_78 = pstore::sstring_view<const_char_*>::substr
                       ((sstring_view<const_char_*> *)&gtest_ar.message_,0,1);
  testing::internal::EqHelper::Compare<pstore::sstring_view<const_char_*>,_char[2],_nullptr>
            ((EqHelper *)local_68,"sv.substr (0U, 1U)","\"a\"",&local_78,(char (*) [2])0x2b3e6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x13f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_a8 = pstore::sstring_view<const_char_*>::substr
                       ((sstring_view<const_char_*> *)&gtest_ar.message_,0,4);
  testing::internal::EqHelper::Compare<pstore::sstring_view<const_char_*>,_char[4],_nullptr>
            ((EqHelper *)local_98,"sv.substr (0U, 4U)","\"abc\"",&local_a8,(char (*) [4])"abc");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x140,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_d8 = pstore::sstring_view<const_char_*>::substr
                       ((sstring_view<const_char_*> *)&gtest_ar.message_,1,1);
  testing::internal::EqHelper::Compare<pstore::sstring_view<const_char_*>,_char[2],_nullptr>
            ((EqHelper *)local_c8,"sv.substr (1U, 1U)","\"b\"",&local_d8,(char (*) [2])0x2bee83);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x141,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  local_108 = pstore::sstring_view<const_char_*>::substr
                        ((sstring_view<const_char_*> *)&gtest_ar.message_,3,1);
  testing::internal::EqHelper::Compare<pstore::sstring_view<const_char_*>,_char[1],_nullptr>
            ((EqHelper *)local_f8,"sv.substr (3U, 1U)","\"\"",&local_108,(char (*) [1])0x2beb04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x142,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST (SStringView, Substr) {
    std::string const src{"abc"};
    using sv_type = pstore::sstring_view<char const *>;
    sv_type sv = pstore::make_sstring_view (src.data (), src.length ());

    EXPECT_EQ (sv.substr (0U, 1U), "a");
    EXPECT_EQ (sv.substr (0U, 4U), "abc");
    EXPECT_EQ (sv.substr (1U, 1U), "b");
    EXPECT_EQ (sv.substr (3U, 1U), "");
}